

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

deUint32 __thiscall glu::sl::ShaderParser::getShaderStageLiteralFlag(ShaderParser *this)

{
  Token TVar1;
  deUint32 dVar2;
  long *plVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  size_type *psVar5;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  TVar1 = this->m_curToken;
  if ((int)TVar1 < 0x2f) {
    dVar2 = 1;
    if (TVar1 != TOKEN_VERTEX) {
      if (TVar1 != TOKEN_FRAGMENT) {
LAB_00a070f2:
        local_38 = 0;
        local_30 = 0;
        local_40 = &local_30;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
        local_80 = (long *)*plVar3;
        plVar4 = plVar3 + 2;
        if (local_80 == plVar4) {
          local_70 = *plVar4;
          lStack_68 = plVar3[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar4;
        }
        local_78 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_80,(ulong)(this->m_curTokenStr)._M_dataplus._M_p)
        ;
        local_60._M_dataplus._M_p = (pointer)*plVar3;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_60._M_dataplus._M_p == psVar5) {
          local_60.field_2._M_allocated_capacity = *psVar5;
          local_60.field_2._8_8_ = plVar3[3];
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        }
        else {
          local_60.field_2._M_allocated_capacity = *psVar5;
        }
        local_60._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        parseError(this,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_40 != &local_30) {
          operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      dVar2 = 2;
    }
  }
  else if (TVar1 == TOKEN_TESSELLATION_CONTROL) {
    dVar2 = 8;
  }
  else if (TVar1 == TOKEN_TESSELLATION_EVALUATION) {
    dVar2 = 0x10;
  }
  else {
    if (TVar1 != TOKEN_GEOMETRY) goto LAB_00a070f2;
    dVar2 = 4;
  }
  return dVar2;
}

Assistant:

deUint32 ShaderParser::getShaderStageLiteralFlag (void)
{
	switch (m_curToken)
	{
		case TOKEN_VERTEX:					return (1 << glu::SHADERTYPE_VERTEX);
		case TOKEN_FRAGMENT:				return (1 << glu::SHADERTYPE_FRAGMENT);
		case TOKEN_GEOMETRY:				return (1 << glu::SHADERTYPE_GEOMETRY);
		case TOKEN_TESSELLATION_CONTROL:	return (1 << glu::SHADERTYPE_TESSELLATION_CONTROL);
		case TOKEN_TESSELLATION_EVALUATION:	return (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION);

		default:
			parseError(std::string() + "invalid shader stage name, got " + m_curTokenStr);
			return 0;
	}
}